

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYElement::readData(PLYElement *this,streambuf *in)

{
  pointer pPVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_t k;
  ulong uVar4;
  long lVar5;
  long i;
  ulong uVar6;
  
  for (uVar6 = 0; (long)uVar6 < this->size; uVar6 = uVar6 + 1) {
    lVar5 = 0x30;
    for (uVar4 = 0;
        pPVar1 = (this->list).
                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this->list).
                              super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 6);
        uVar4 = uVar4 + 1) {
      plVar2 = *(long **)((long)&pPVar1->enc + lVar5);
      (**(code **)(*plVar2 + 0x10))(plVar2,in);
      puVar3 = *(undefined8 **)((long)&(pPVar1->name)._M_dataplus._M_p + lVar5);
      if (puVar3 != (undefined8 *)0x0) {
        (**(code **)*puVar3)(puVar3,uVar6 & 0xffffffff,*(undefined8 *)((long)&pPVar1->enc + lVar5));
      }
      lVar5 = lVar5 + 0x40;
    }
  }
  return;
}

Assistant:

void PLYElement::readData(std::streambuf *in)
{
  for (long i=0; i<size; i++)
  {
    for (size_t k=0; k<list.size(); k++)
    {
      list[k].readData(in, i);
    }
  }
}